

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void mine<true>(randomx_vm *vm,atomic<unsigned_int> *atomicNonce,AtomicHash *result,
               uint32_t noncesCount,int thread,int cpuid)

{
  ostream *poVar1;
  uint in_ECX;
  AtomicHash *this;
  uint64_t *in_RSI;
  int in_R8D;
  int in_R9D;
  __int_type_conflict nonce;
  void *noncePtr;
  uint8_t blockTemplate [76];
  uint64_t hash [4];
  int rc;
  void *in_stack_fffffffffffffef8;
  randomx_vm *in_stack_ffffffffffffff00;
  uint64_t *update;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t w;
  randomx_vm *machine;
  undefined8 uStack_b0;
  undefined1 uStack_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined4 uStack_a0;
  undefined4 local_9c;
  undefined4 uStack_98;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  int local_58;
  int local_50;
  uint local_4c;
  uint64_t *local_40;
  uint32_t local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  uint64_t *local_20;
  uint32_t local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  uint64_t *local_8;
  
  local_4c = in_ECX;
  local_40 = in_RSI;
  if ((-1 < in_R9D) &&
     (local_50 = in_R8D, local_58 = set_thread_affinity((uint *)in_stack_ffffffffffffff00),
     local_58 != 0)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Failed to set thread affinity for thread ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50);
    poVar1 = std::operator<<(poVar1," (error=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_58);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  uStack_98 = 0xd25cf9ee;
  uStack_94 = '\f';
  uStack_93 = 0xef;
  uStack_92 = 0xc1;
  uStack_91 = '/';
  uStack_90 = 'a';
  uStack_8f = 0xd5;
  uStack_8e = 'a';
  uStack_8d = '\t';
  uStack_a8 = 0xa5;
  uStack_a7 = 0xb1;
  uStack_a6 = 0xd4;
  uStack_a5 = 0xce;
  uStack_a4 = 'k';
  uStack_a3 = 0xbf;
  uStack_a2 = 0xdf;
  uStack_a1 = '\n';
  uStack_a0 = 0xde8bc3ca;
  local_9c = 0xcd2d4dd3;
  uStack_b0 = 0x2ca006b277000000;
  machine = (randomx_vm *)&stack0xffffffffffffff4f;
  local_8 = local_40;
  local_c = 1;
  local_10 = 5;
  local_14 = 1;
  this = (AtomicHash *)0x4;
  LOCK();
  w = (uint32_t)*local_40;
  *(uint32_t *)local_40 = (uint32_t)*local_40 + 1;
  UNLOCK();
  update = local_40;
  local_18 = w;
  store32(machine,w);
  randomx_calculate_hash_first(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0x10aaac);
  while (w < local_4c) {
    local_20 = local_40;
    local_24 = 1;
    local_28 = 5;
    local_2c = 1;
    LOCK();
    w = (uint32_t)*local_40;
    *(uint32_t *)local_40 = (uint32_t)*local_40 + 1;
    UNLOCK();
    local_30 = w;
    store32(machine,w);
    randomx_calculate_hash_next
              (machine,(void *)CONCAT44(w,in_stack_ffffffffffffff18),(size_t)this,update);
    AtomicHash::xorWith(this,update);
  }
  return;
}

Assistant:

void mine(randomx_vm* vm, std::atomic<uint32_t>& atomicNonce, AtomicHash& result, uint32_t noncesCount, int thread, int cpuid = -1) {
	if (cpuid >= 0) {
		int rc = set_thread_affinity(cpuid);
		if (rc) {
			std::cerr << "Failed to set thread affinity for thread " << thread << " (error=" << rc << ")" << std::endl;
		}
	}
	uint64_t hash[RANDOMX_HASH_SIZE / sizeof(uint64_t)];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	void* noncePtr = blockTemplate + 39;
	auto nonce = atomicNonce.fetch_add(1);

	if (batch) {
		store32(noncePtr, nonce);
		randomx_calculate_hash_first(vm, blockTemplate, sizeof(blockTemplate));
	}

	while (nonce < noncesCount) {
		if (batch) {
			nonce = atomicNonce.fetch_add(1);
		}
		store32(noncePtr, nonce);
		(batch ? randomx_calculate_hash_next : randomx_calculate_hash)(vm, blockTemplate, sizeof(blockTemplate), &hash);
		result.xorWith(hash);
		if (!batch) {
			nonce = atomicNonce.fetch_add(1);
		}
	}
}